

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFTokenizer.cc
# Opt level: O2

void __thiscall QPDFTokenizer::Token::Token(Token *this,token_type_e type,string *value)

{
  undefined1 auStack_58 [16];
  string local_48;
  
  this->type = type;
  std::__cxx11::string::string((string *)&this->value,(string *)value);
  std::__cxx11::string::string((string *)&this->raw_value,(string *)value);
  (this->error_message)._M_dataplus._M_p = (pointer)&(this->error_message).field_2;
  (this->error_message)._M_string_length = 0;
  (this->error_message).field_2._M_local_buf[0] = '\0';
  if (type == tt_name) {
    QPDFObjectHandle::newName((string *)auStack_58);
    QPDFObjectHandle::unparse_abi_cxx11_
              ((string *)(auStack_58 + 0x10),(QPDFObjectHandle *)auStack_58);
  }
  else {
    if (type != tt_string) {
      return;
    }
    QPDFObjectHandle::newString((string *)auStack_58);
    QPDFObjectHandle::unparse_abi_cxx11_
              ((string *)(auStack_58 + 0x10),(QPDFObjectHandle *)auStack_58);
  }
  std::__cxx11::string::operator=((string *)&this->raw_value,(string *)(auStack_58 + 0x10));
  std::__cxx11::string::~string((string *)(auStack_58 + 0x10));
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(auStack_58 + 8));
  return;
}

Assistant:

QPDFTokenizer::Token::Token(token_type_e type, std::string const& value) :
    type(type),
    value(value),
    raw_value(value)
{
    if (type == tt_string) {
        raw_value = QPDFObjectHandle::newString(value).unparse();
    } else if (type == tt_name) {
        raw_value = QPDFObjectHandle::newName(value).unparse();
    }
}